

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

void __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Abort
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Chunk *temp;
  Chunk *chunk;
  
  chunk = this->currentChunk;
  if (chunk == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x16e,"(count == 0)","count == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    while (chunk->nextChunk != (Chunk *)0x0) {
      this->currentChunk = chunk->nextChunk;
      FreeChunk(this,chunk);
      chunk = this->currentChunk;
    }
    this->chunkStart = (MarkCandidate *)(chunk + 1);
    this->chunkEnd = (MarkCandidate *)(chunk + 0x80);
    this->nextEntry = (MarkCandidate *)(chunk + 1);
    this->count = 0;
  }
  return;
}

Assistant:

void PageStack<T>::Abort()
{
    // Abandon the current entries in the stack and reset to initialized state.

    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        return;
    }

    // Free all the chunks except the first one
    while (currentChunk->nextChunk != nullptr)
    {
        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);
    }

    chunkStart = currentChunk->entries;
    chunkEnd = &currentChunk->entries[EntriesPerChunk];
    nextEntry = chunkStart;

#if DBG
    count = 0;
#endif
}